

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O2

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image,integral_image *iimage)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined1 (*pauVar5) [16];
  float fVar6;
  uint uVar7;
  size_t i_2;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  long lVar16;
  byte *pbVar17;
  long lVar18;
  ulong uVar19;
  float *pfVar20;
  long lVar21;
  int i;
  undefined4 uVar22;
  long lVar23;
  long lVar24;
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  int iVar27;
  byte *pbVar28;
  long lVar29;
  int i_4;
  long lVar30;
  size_t i_3;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar40 [16];
  undefined1 in_XMM8 [16];
  
  iVar3 = iimage->data_width;
  lVar21 = (long)iVar3;
  iVar27 = iimage->width;
  uVar19 = (ulong)iVar27;
  pfVar12 = iimage->padded_data;
  lVar33 = (long)iimage->data_height;
  iVar4 = iimage->height;
  lVar18 = lVar21 * 4;
  lVar1 = lVar21 + -7;
  uVar7 = (iVar3 - iVar27) / 2;
  pfVar11 = pfVar12;
  for (uVar8 = 0; uVar8 != (~((int)uVar7 >> 0x1f) & uVar7); uVar8 = uVar8 + 1) {
    pfVar15 = pfVar11;
    for (lVar23 = 0; lVar23 < lVar1; lVar23 = lVar23 + 8) {
      pfVar20 = pfVar11 + lVar23;
      pfVar20[0] = 0.0;
      pfVar20[1] = 0.0;
      pfVar20[2] = 0.0;
      pfVar20[3] = 0.0;
      pfVar20[4] = 0.0;
      pfVar20[5] = 0.0;
      pfVar20[6] = 0.0;
      pfVar20[7] = 0.0;
      pfVar15 = pfVar15 + 8;
    }
    for (; lVar23 < lVar21; lVar23 = lVar23 + 1) {
      *pfVar15 = 0.0;
      pfVar15 = pfVar15 + 1;
    }
    pfVar11 = pfVar11 + lVar21;
  }
  lVar14 = (long)(int)uVar7;
  lVar9 = lVar21 * lVar14;
  pfVar11 = pfVar12 + lVar9;
  for (lVar23 = lVar14; auVar38 = _DAT_00160220, lVar23 < lVar33; lVar23 = lVar23 + 1) {
    pfVar15 = pfVar11;
    for (lVar24 = 0; lVar24 < (int)(uVar7 - 7); lVar24 = lVar24 + 8) {
      *(undefined1 (*) [32])(pfVar11 + lVar24) = ZEXT432(0) << 0x40;
      pfVar15 = pfVar15 + 8;
    }
    for (; lVar24 < lVar14; lVar24 = lVar24 + 1) {
      *pfVar15 = 0.0;
      pfVar15 = pfVar15 + 1;
    }
    pfVar11 = pfVar11 + lVar21;
  }
  pauVar5 = (undefined1 (*) [16])iimage->data;
  auVar39 = ZEXT1664((undefined1  [16])0x0);
  uVar8 = (ulong)(iVar27 / 4 << 2);
  for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 4) {
    auVar37 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38,
                                ZEXT432(*(uint *)(gray_image + uVar10)));
    auVar37 = vpsadbw_avx2(auVar37,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar37 = vpaddd_avx2(auVar37,auVar39._0_32_);
    auVar35 = vpmovqd_avx512vl(auVar37);
    *(undefined1 (*) [16])(*pauVar5 + uVar10 * 4) = auVar35;
    auVar37 = vpermq_avx2(auVar37,0xff);
    auVar39 = ZEXT3264(auVar37);
  }
  iVar13 = *(int *)(pauVar5[-1] + uVar10 * 4 + 0xc);
  for (; uVar10 < uVar19; uVar10 = uVar10 + 1) {
    iVar13 = iVar13 + (uint)gray_image[uVar10];
    *(int *)(*pauVar5 + uVar10 * 4) = iVar13;
  }
  pfVar11 = iimage->data;
  pbVar28 = gray_image + uVar19;
  lVar23 = 0;
  pfVar15 = pfVar11;
  pauVar25 = pauVar5;
  for (uVar10 = 1; uVar10 < (ulong)(long)iVar4; uVar10 = uVar10 + 1) {
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    pbVar17 = pbVar28;
    pauVar26 = pauVar25;
    lVar24 = lVar23;
    for (uVar31 = 0; uVar31 < uVar8; uVar31 = uVar31 + 4) {
      lVar24 = lVar24 + 0x10;
      pbVar17 = pbVar17 + 4;
      auVar37 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar38,
                                  ZEXT432(*(uint *)(pbVar28 + uVar31)));
      auVar37 = vpsadbw_avx2(auVar37,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar37 = vpaddd_avx2(auVar37,auVar39._0_32_);
      auVar36 = vpmovqd_avx512vl(auVar37);
      auVar37 = vpermq_avx2(auVar37,0xff);
      auVar39 = ZEXT3264(auVar37);
      auVar35 = vcvtdq2ps_avx(*pauVar26);
      auVar36 = vpaddd_avx(*pauVar26,auVar36);
      in_ZMM5 = ZEXT1664(auVar36);
      auVar40._0_4_ = auVar35._0_4_ * 0.003921569;
      auVar40._4_4_ = auVar35._4_4_ * 0.003921569;
      auVar40._8_4_ = auVar35._8_4_ * 0.003921569;
      auVar40._12_4_ = auVar35._12_4_ * 0.003921569;
      *(undefined1 (*) [16])(pfVar15 + uVar31) = auVar40;
      *(undefined1 (*) [16])(*pauVar26 + lVar18) = auVar36;
      pauVar26 = pauVar26 + 1;
    }
    iVar13 = *(int *)(pauVar26[-1] + lVar18 + 0xc) - *(int *)(pauVar26[-1] + 0xc);
    while (uVar31 < uVar19) {
      auVar35 = vcvtusi2ss_avx512f(in_XMM8,*(undefined4 *)(*pauVar5 + lVar24));
      bVar2 = *pbVar17;
      uVar31 = uVar31 + 1;
      pbVar17 = pbVar17 + 1;
      iVar13 = iVar13 + (uint)bVar2;
      auVar36 = vcvtusi2ss_avx512f(in_XMM8,iVar13);
      fVar6 = auVar35._0_4_ + auVar36._0_4_;
      in_ZMM5 = ZEXT464((uint)fVar6);
      uVar22 = vcvttss2usi_avx512f(ZEXT416((uint)fVar6));
      *(undefined4 *)(*pauVar5 + lVar24 + lVar21 * 4) = uVar22;
      *(float *)((long)pfVar11 + lVar24) = auVar35._0_4_ * 0.003921569;
      lVar24 = lVar24 + 4;
    }
    pbVar28 = pbVar28 + uVar19;
    pfVar15 = pfVar15 + lVar21;
    pauVar25 = (undefined1 (*) [16])(*pauVar25 + lVar18);
    lVar23 = lVar23 + lVar18;
  }
  lVar23 = (long)((iVar4 + -1) * iVar3);
  for (uVar8 = 0; uVar8 < uVar19 - 7; uVar8 = uVar8 + 8) {
    auVar38 = vcvtdq2ps_avx(*(undefined1 (*) [32])(*pauVar5 + uVar8 * 4 + lVar23 * 4));
    pfVar15 = pfVar11 + lVar23 + uVar8;
    *pfVar15 = auVar38._0_4_ * 0.003921569;
    pfVar15[1] = auVar38._4_4_ * 0.003921569;
    pfVar15[2] = auVar38._8_4_ * 0.003921569;
    pfVar15[3] = auVar38._12_4_ * 0.003921569;
    pfVar15[4] = auVar38._16_4_ * 0.003921569;
    pfVar15[5] = auVar38._20_4_ * 0.003921569;
    pfVar15[6] = auVar38._24_4_ * 0.003921569;
    pfVar15[7] = auVar38._28_4_;
  }
  for (; uVar8 < uVar19; uVar8 = uVar8 + 1) {
    auVar35 = vcvtusi2ss_avx512f(in_ZMM5._0_16_,*(undefined4 *)(*pauVar5 + uVar8 * 4 + lVar23 * 4));
    pfVar11[lVar23 + uVar8] = auVar35._0_4_ * 0.003921569;
  }
  iVar27 = uVar7 + iVar27;
  lVar24 = (long)iVar27;
  pfVar11 = pfVar12 + lVar9;
  lVar32 = iVar4 + lVar14;
  pfVar15 = pfVar12 + lVar9 + lVar24;
  for (lVar23 = lVar14; lVar23 < lVar32; lVar23 = lVar23 + 1) {
    fVar6 = pfVar12[(long)((int)lVar23 * iVar3 + iVar27) + -1];
    auVar38._4_4_ = fVar6;
    auVar38._0_4_ = fVar6;
    auVar38._8_4_ = fVar6;
    auVar38._12_4_ = fVar6;
    auVar38._16_4_ = fVar6;
    auVar38._20_4_ = fVar6;
    auVar38._24_4_ = fVar6;
    auVar38._28_4_ = fVar6;
    pfVar20 = pfVar15;
    for (lVar9 = lVar24; lVar9 < lVar1; lVar9 = lVar9 + 8) {
      *(undefined1 (*) [32])(pfVar11 + lVar9) = auVar38;
      pfVar20 = pfVar20 + 8;
    }
    for (; lVar9 < lVar21; lVar9 = lVar9 + 1) {
      *pfVar20 = fVar6;
      pfVar20 = pfVar20 + 1;
    }
    pfVar11 = pfVar11 + lVar21;
    pfVar15 = pfVar15 + lVar21;
  }
  lVar29 = (lVar32 + -1) * lVar21;
  lVar9 = lVar21 * lVar32;
  pfVar11 = pfVar12 + lVar29;
  pfVar15 = pfVar12 + lVar9;
  lVar34 = 0;
  for (lVar23 = lVar32; lVar16 = lVar34, lVar30 = lVar14, lVar23 < lVar33; lVar23 = lVar23 + 1) {
    for (; lVar30 < iVar27 + -7; lVar30 = lVar30 + 8) {
      lVar16 = lVar16 + 0x20;
      *(undefined1 (*) [32])(pfVar15 + lVar30) = *(undefined1 (*) [32])(pfVar11 + lVar30);
    }
    for (; lVar30 < lVar24; lVar30 = lVar30 + 1) {
      *(undefined4 *)((long)pfVar12 + lVar16 + lVar14 * 4 + lVar9 * 4) =
           *(undefined4 *)((long)pfVar12 + lVar16 + lVar14 * 4 + lVar29 * 4);
      lVar16 = lVar16 + 4;
    }
    pfVar11 = pfVar11 + lVar21;
    pfVar15 = pfVar15 + lVar21;
    lVar34 = lVar34 + lVar18;
  }
  fVar6 = pfVar12[(long)(iVar27 + ((int)lVar32 + -1) * iVar3) + -1];
  pfVar11 = pfVar12 + lVar9;
  pfVar12 = pfVar12 + lVar9 + lVar24;
  for (; pfVar15 = pfVar12, lVar18 = lVar24, lVar32 < lVar33; lVar32 = lVar32 + 1) {
    for (; lVar18 < lVar1; lVar18 = lVar18 + 8) {
      pfVar20 = pfVar11 + lVar18;
      *pfVar20 = fVar6;
      pfVar20[1] = fVar6;
      pfVar20[2] = fVar6;
      pfVar20[3] = fVar6;
      pfVar20[4] = fVar6;
      pfVar20[5] = fVar6;
      pfVar20[6] = fVar6;
      pfVar20[7] = fVar6;
      pfVar15 = pfVar15 + 8;
    }
    for (; lVar18 < lVar21; lVar18 = lVar18 + 1) {
      *pfVar15 = fVar6;
      pfVar15 = pfVar15 + 1;
    }
    pfVar11 = pfVar11 + lVar21;
    pfVar12 = pfVar12 + lVar21;
  }
  return;
}

Assistant:

void compute_padded_integral_img_simd_early_cast_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
        __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
        //__m256i ZERO = _mm256_set1_epi32(0);
        __m256i ZERO = _mm256_setzero_si256();
        
        // Implementation adapted from:
        // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
        // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

        uint32_t *iimage_idata = (uint32_t *) iimage->data;

        size_t aligned_width = width / 4 * 4;

        {
            __m256i row_sums = ZERO;
            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
                
                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                // 
                _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }
            uint32_t row_sum = iimage_idata[i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[i];
                iimage_idata[i] = row_sum;
            }
        }

        float *iimage_data = iimage->data;
        __m128 factor = _mm_set1_ps(1.0f / 255.0f);

        for(size_t j = 1; j < height; ++j) {

            __m256i row_sums = ZERO;

            size_t i = 0;
            for(; i < aligned_width; i+=4) {

                // If (gray_image + i) has following uint8_t pixels: a b c d
                // a0000000 ab000000 abc00000 abcd0000
                __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
                
                // Summing together blocks of 8 uint8_t's and storing results
                // uint32_t eeee = a
                // uint32_t ffff = a + b
                // uint32_t gggg = a + b + c
                // uint32_t hhhh = a + b + c + d
                // eeee0000 ffff0000 gggg0000 hhhh0000
                __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

                // Updating row_sum by adding previously computed img_sad_sum
                //   eeee0000 ffff0000 hhhh0000 hhhh0000
                // + iiii**** jjjj**** kkkk**** llll****
                // -------------------------------------
                //   mmmm**** nnnn**** oooo**** pppp****
                row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

                // Permuting row_sum from first row to second and cutting off upper 128 bits
                // mmmm**** nnnn**** oooo**** pppp****
                // mmmmnnnn oooopppp ******** ********
                __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

                // Loading row_sum from previous row
                __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
                //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

                // AVX512 only :(
                //__m128 prev_row_sums_cast = _mm_cvtepu32_ps(prev_row_sums);
                __m128 prev_row_sums_cast = _mm_cvtepi32_ps(prev_row_sums);
                //__128 prev_row_sums_cast = _my_mm_cvtepu32_ps(prev_row_sums);

                // Multiplying float version of previous row sum converted with (1.0f/255.0f) 
                __m128 prev_iimage_float = _mm_mul_ps(factor, prev_row_sums_cast);

                // Storing float of previous row sum back to memory as final integral image value
                _mm_storeu_ps(iimage_data +(j-1) * data_width + i, prev_iimage_float);

                // Adding curr_row_sums with prev_row_sums
                __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

                // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
                _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
                //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
                
                // Updating row_sums to only include highest of four values (pppp)
                // mmmm**** nnnn**** oooo**** pppp****
                // pppp**** pppp**** pppp**** pppp****
                row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

            }

            uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
            for (; i < width; ++i) {
                row_sum += gray_image[j * width + i];
                float prev_row_sum = iimage_idata[(j-1) * data_width + i];
                iimage_idata[j * data_width + i] = row_sum + prev_row_sum;
                iimage_data[(j-1) * data_width + i] = (1.0f / 255.0f) * ((float) prev_row_sum);
            }

        }

        // Converting last row to floats
        __m256 factor256 = _mm256_set1_ps(1.0f / 255.0f);
        size_t i = 0;
        for (; i < width - 7; i+=8) { // TODO: Check if -7 correct here

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + (height - 1) * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor256, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + (height - 1) * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[(height - 1) * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[(height - 1) * data_width + i]);
        }

    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }
 
// TODO: WRITE SECOND VERSION WITH COLMAJOR
/*  
    int i = border;
    for (; i < width + border - 7; i+=8) {
        __m256 prev_elements_in_row_vec = _mm256_loadu_ps(iimage_padded_data + (border + height - 1) * data_width + i);
        for (int j = border + height; j < data_height; ++j) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row_vec);
        }
    }
    for (; i < width + border; ++i) {
        float prev_elements_in_row_float = iimage_padded_data[(border + height - 1) * data_width + i];
        for (int j = border + height; j < data_height; ++j) {
            iimage_padded_data[j * data_width + i] = prev_elements_in_row_float;
        }
    }
*/    

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}